

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *pAVar1;
  GenericTypeHandler<google::protobuf::Message> *this_00;
  int iVar2;
  Message *to;
  Message *extraout_RDX;
  long lVar3;
  undefined1 auVar4 [16];
  
  iVar2 = length;
  if (already_allocated < length) {
    iVar2 = already_allocated;
  }
  to = (Message *)other_elems;
  for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
    GenericTypeHandler<google::protobuf::Message>::Merge
              ((GenericTypeHandler<google::protobuf::Message> *)other_elems[lVar3],
               (Message *)our_elems[lVar3],to);
    to = extraout_RDX;
  }
  pAVar1 = this->arena_;
  for (lVar3 = (long)already_allocated; lVar3 < length; lVar3 = lVar3 + 1) {
    this_00 = (GenericTypeHandler<google::protobuf::Message> *)other_elems[lVar3];
    auVar4 = (**(code **)(*(long *)this_00 + 0x20))(this_00,pAVar1);
    GenericTypeHandler<google::protobuf::Message>::Merge(this_00,auVar4._0_8_,auVar4._8_8_);
    our_elems[lVar3] = auVar4._0_8_;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArenaNoVirtual();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}